

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::InstancingGroup::init
          (InstancingGroup *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  InstancedGridRenderTest *pIVar1;
  int *piVar2;
  long lVar3;
  allocator<char> local_139;
  long local_138;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string name;
  int gridWidths [5];
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  gridWidths[0] = 2;
  gridWidths[1] = 5;
  gridWidths[2] = 10;
  gridWidths[3] = 0x20;
  gridWidths[4] = 100;
  lVar3 = 0;
  while (lVar3 != 0x14) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"draw_arrays_instanced_grid_",(allocator<char> *)&local_b0);
    piVar2 = (int *)((long)gridWidths + lVar3);
    local_138 = lVar3;
    de::toString<int>(&local_70,piVar2);
    std::operator+(&local_108,&local_50,&local_70);
    std::operator+(&desc,&local_108,"x");
    de::toString<int>(&local_90,piVar2);
    std::operator+(&name,&desc,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"DrawArraysInstanced, Grid size ",&local_139);
    de::toString<int>(&local_90,piVar2);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_108,&local_50,"x");
    de::toString<int>(&local_b0,piVar2);
    std::operator+(&desc,&local_108,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = (InstancedGridRenderTest *)operator_new(0x80);
    InstancedGridRenderTest::InstancedGridRenderTest
              (pIVar1,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p,*piVar2,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar1);
    std::__cxx11::string::~string((string *)&desc);
    in_EAX = std::__cxx11::string::~string((string *)&name);
    lVar3 = local_138 + 4;
  }
  lVar3 = 0;
  while (lVar3 != 0x14) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"draw_elements_instanced_grid_",(allocator<char> *)&local_b0);
    piVar2 = (int *)((long)gridWidths + lVar3);
    local_138 = lVar3;
    de::toString<int>(&local_70,piVar2);
    std::operator+(&local_108,&local_50,&local_70);
    std::operator+(&desc,&local_108,"x");
    de::toString<int>(&local_90,piVar2);
    std::operator+(&name,&desc,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"DrawElementsInstanced, Grid size ",&local_139);
    de::toString<int>(&local_90,piVar2);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_108,&local_50,"x");
    de::toString<int>(&local_b0,piVar2);
    std::operator+(&desc,&local_108,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = (InstancedGridRenderTest *)operator_new(0x80);
    InstancedGridRenderTest::InstancedGridRenderTest
              (pIVar1,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p,*piVar2,true);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar1);
    std::__cxx11::string::~string((string *)&desc);
    in_EAX = std::__cxx11::string::~string((string *)&name);
    lVar3 = local_138 + 4;
  }
  return in_EAX;
}

Assistant:

void InstancingGroup::init (void)
{
	const int gridWidths[] =
	{
		2,
		5,
		10,
		32,
		100,
	};

	// drawArrays
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_arrays_instanced_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawArraysInstanced, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], false));
	}

	// drawElements
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_elements_instanced_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawElementsInstanced, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], true));
	}
}